

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O0

idx puppup::movegen::__impl::orthogonal(idx step,idx cursor,Gaddag *gaddag,State *state)

{
  bool bVar1;
  const_reference pvVar2;
  bool bVar3;
  long local_50;
  idx depth;
  chr node;
  idx score;
  idx orig_cursor;
  State *state_local;
  Gaddag *gaddag_local;
  idx cursor_local;
  idx step_local;
  
  pvVar2 = std::array<long,_256UL>::operator[](&state->board,cursor + step);
  if ((*pvVar2 == 0x1b) &&
     (pvVar2 = std::array<long,_256UL>::operator[](&state->board,cursor - step), *pvVar2 == 0x1b)) {
    return 0;
  }
  pvVar2 = std::array<long,_256UL>::operator[](&state->letter_score,cursor);
  node = *pvVar2 * *(long *)(board::letter_multiplier + cursor * 8);
  pvVar2 = std::array<long,_256UL>::operator[](&state->board,cursor);
  depth = trie::Gaddag::get(gaddag,0,*pvVar2);
  gaddag_local = (Gaddag *)(step + cursor);
  local_50 = 0;
  while( true ) {
    bVar1 = edge((idx)gaddag_local);
    bVar3 = false;
    if (!bVar1) {
      pvVar2 = std::array<long,_256UL>::operator[](&state->board,(size_type)gaddag_local);
      bVar3 = *pvVar2 != 0x1b;
    }
    if (!bVar3) break;
    pvVar2 = std::array<long,_256UL>::operator[](&state->letter_score,(size_type)gaddag_local);
    node = *pvVar2 + node;
    pvVar2 = std::array<long,_256UL>::operator[](&state->board,(size_type)gaddag_local);
    bVar3 = trie::Gaddag::has(gaddag,depth,*pvVar2);
    if (!bVar3) {
      return -1;
    }
    pvVar2 = std::array<long,_256UL>::operator[](&state->board,(size_type)gaddag_local);
    depth = trie::Gaddag::get(gaddag,depth,*pvVar2);
    gaddag_local = (Gaddag *)
                   ((long)&(gaddag_local->words_).
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + step);
    local_50 = local_50 + 1;
  }
  bVar3 = trie::Gaddag::has(gaddag,depth,0x1f);
  if (!bVar3) {
    return -1;
  }
  depth = trie::Gaddag::get(gaddag,depth,0x1f);
  gaddag_local = (Gaddag *)(cursor + -step);
  while( true ) {
    bVar1 = edge((idx)gaddag_local);
    bVar3 = false;
    if (!bVar1) {
      pvVar2 = std::array<long,_256UL>::operator[](&state->board,(size_type)gaddag_local);
      bVar3 = *pvVar2 != 0x1b;
    }
    if (!bVar3) break;
    pvVar2 = std::array<long,_256UL>::operator[](&state->letter_score,(size_type)gaddag_local);
    node = *pvVar2 + node;
    pvVar2 = std::array<long,_256UL>::operator[](&state->board,(size_type)gaddag_local);
    bVar3 = trie::Gaddag::has(gaddag,depth,*pvVar2);
    if (!bVar3) {
      return -1;
    }
    pvVar2 = std::array<long,_256UL>::operator[](&state->board,(size_type)gaddag_local);
    depth = trie::Gaddag::get(gaddag,depth,*pvVar2);
    gaddag_local = (Gaddag *)(-step + (long)gaddag_local);
    local_50 = local_50 + 1;
  }
  if ((0 < local_50) && (bVar3 = trie::Gaddag::exists(gaddag,depth), !bVar3)) {
    return -1;
  }
  node = *(long *)(board::word_multiplier + cursor * 8) * node;
  if (local_50 == 0) {
    node = 0;
  }
  return node;
}

Assistant:

idx orthogonal(idx step, idx cursor, const trie::Gaddag& gaddag,
               const board::State& state) {
    if (state.board[cursor + step] == emptiness &&
        state.board[cursor - step] == emptiness) {
        return 0;
    }
    const idx orig_cursor = cursor;
    idx score = state.letter_score[cursor] * board::letter_multiplier[cursor];

    chr node = gaddag.get(0, state.board[cursor]);
    cursor += step;
    idx depth = 0;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (!gaddag.has(node, trie::rev_marker)) return -1;
    node = gaddag.get(node, trie::rev_marker);
    step = -step;
    cursor = orig_cursor + step;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (depth > 0 && !gaddag.exists(node)) return -1;
    score *= board::word_multiplier[orig_cursor];
    if (depth == 0) score = 0;
    return score;
}